

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::RecordReturned(MergeReturnPass *this,BasicBlock *block)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> __l_00;
  ConstantManager *type;
  Op OVar1;
  int iVar2;
  Instruction *pIVar3;
  IRContext *pIVar4;
  TypeManager *this_00;
  Type *pTVar5;
  undefined4 extraout_var;
  ConstantManager *this_01;
  Constant *c;
  bool bVar6;
  Operand *local_1f8;
  undefined1 local_1c0 [24];
  Instruction *store_inst;
  Instruction *local_1a0;
  Instruction *local_198;
  undefined1 local_164 [12];
  pointer local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  Operand local_128;
  Operand OStack_f8;
  iterator local_c8;
  _func_int **local_c0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_b8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  return_store;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  Constant *local_68;
  Constant *true_const;
  ConstantManager *const_mgr;
  Bool *bool_type;
  Bool temp;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_18;
  BasicBlock *block_local;
  MergeReturnPass *this_local;
  
  local_18._M_head_impl = (Instruction *)block;
  block_local = (BasicBlock *)this;
  BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0);
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)&stack0xffffffffffffffe0);
  OVar1 = Instruction::opcode(pIVar3);
  bVar6 = false;
  if (OVar1 != OpReturn) {
    BasicBlock::tail((BasicBlock *)&temp.super_Type.kind_);
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)&temp.super_Type.kind_);
    OVar1 = Instruction::opcode(pIVar3);
    bVar6 = OVar1 != OpReturnValue;
  }
  if (!bVar6) {
    if (this->return_flag_ == (Instruction *)0x0) {
      __assert_fail("return_flag_ && \"Did not generate the return flag variable.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x21f,"void spvtools::opt::MergeReturnPass::RecordReturned(BasicBlock *)");
    }
    if (this->constant_true_ == (Instruction *)0x0) {
      analysis::Bool::Bool((Bool *)&bool_type);
      pIVar4 = Pass::context((Pass *)this);
      this_00 = IRContext::get_type_mgr(pIVar4);
      pTVar5 = analysis::TypeManager::GetRegisteredType(this_00,(Type *)&bool_type);
      iVar2 = (*pTVar5->_vptr_Type[7])();
      const_mgr = (ConstantManager *)CONCAT44(extraout_var,iVar2);
      pIVar4 = Pass::context((Pass *)this);
      this_01 = IRContext::get_constant_mgr(pIVar4);
      type = const_mgr;
      return_store._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
      true_const = (Constant *)this_01;
      std::allocator<unsigned_int>::allocator
                ((allocator<unsigned_int> *)
                 ((long)&return_store._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 3));
      __l_00._M_len = 1;
      __l_00._M_array =
           (iterator)
           ((long)&return_store._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_80,__l_00,
                 (allocator_type *)
                 ((long)&return_store._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 3));
      c = analysis::ConstantManager::GetConstant(this_01,(Type *)type,&local_80);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
      std::allocator<unsigned_int>::~allocator
                ((allocator<unsigned_int> *)
                 ((long)&return_store._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 3));
      local_68 = c;
      pIVar3 = analysis::ConstantManager::GetDefiningInstruction
                         ((ConstantManager *)true_const,c,0,(inst_iterator *)0x0);
      this->constant_true_ = pIVar3;
      pIVar4 = Pass::context((Pass *)this);
      IRContext::UpdateDefUse(pIVar4,this->constant_true_);
      analysis::Bool::~Bool((Bool *)&bool_type);
    }
    pIVar3 = (Instruction *)operator_new(0x70);
    pIVar4 = Pass::context((Pass *)this);
    local_164._0_4_ = Instruction::result_id(this->return_flag_);
    local_164._4_8_ = local_164;
    local_158 = (pointer)0x1;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_164._4_8_;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_00);
    Operand::Operand(&local_128,SPV_OPERAND_TYPE_ID,&local_150);
    store_inst._4_4_ = Instruction::result_id(this->constant_true_);
    local_1a0 = (Instruction *)((long)&store_inst + 4);
    local_198 = (Instruction *)0x1;
    init_list._M_len = 1;
    init_list._M_array = (iterator)local_1a0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&stack0xfffffffffffffe70,init_list);
    Operand::Operand(&OStack_f8,SPV_OPERAND_TYPE_ID,(OperandData *)&stack0xfffffffffffffe70);
    local_c8 = &local_128;
    local_c0 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&store_inst + 3));
    __l._M_len = (size_type)local_c0;
    __l._M_array = local_c8;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_b8,__l,(allocator_type *)((long)&store_inst + 3));
    Instruction::Instruction(pIVar3,pIVar4,OpStore,0,0,&local_b8);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_a0,pIVar3);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_b8)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&store_inst + 3));
    local_1f8 = (Operand *)&local_c8;
    do {
      local_1f8 = local_1f8 + -1;
      Operand::~Operand(local_1f8);
    } while (local_1f8 != &local_128);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&stack0xfffffffffffffe70);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
    BasicBlock::tail((BasicBlock *)local_1c0);
    InstructionList::iterator::InsertBefore
              ((iterator *)(local_1c0 + 8),
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_1c0);
    local_1c0._16_8_ =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)(local_1c0 + 8));
    pIVar4 = Pass::context((Pass *)this);
    IRContext::set_instr_block
              (pIVar4,(Instruction *)local_1c0._16_8_,(BasicBlock *)local_18._M_head_impl);
    pIVar4 = Pass::context((Pass *)this);
    IRContext::AnalyzeDefUse(pIVar4,(Instruction *)local_1c0._16_8_);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_a0);
  }
  return;
}

Assistant:

void MergeReturnPass::RecordReturned(BasicBlock* block) {
  if (block->tail()->opcode() != spv::Op::OpReturn &&
      block->tail()->opcode() != spv::Op::OpReturnValue)
    return;

  assert(return_flag_ && "Did not generate the return flag variable.");

  if (!constant_true_) {
    analysis::Bool temp;
    const analysis::Bool* bool_type =
        context()->get_type_mgr()->GetRegisteredType(&temp)->AsBool();

    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    const analysis::Constant* true_const =
        const_mgr->GetConstant(bool_type, {true});
    constant_true_ = const_mgr->GetDefiningInstruction(true_const);
    context()->UpdateDefUse(constant_true_);
  }

  std::unique_ptr<Instruction> return_store(new Instruction(
      context(), spv::Op::OpStore, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {return_flag_->result_id()}},
          {SPV_OPERAND_TYPE_ID, {constant_true_->result_id()}}}));

  Instruction* store_inst =
      &*block->tail().InsertBefore(std::move(return_store));
  context()->set_instr_block(store_inst, block);
  context()->AnalyzeDefUse(store_inst);
}